

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O1

void __thiscall Container::kill_all(Container *this)

{
  int iVar1;
  __pid_t _Var2;
  int *piVar3;
  ContextManager *pCVar4;
  int status;
  string local_50;
  undefined1 local_2c [4];
  
  stop_timer();
  iVar1 = kill(-1,9);
  if (iVar1 != 0) {
    piVar3 = __errno_location();
    if (*piVar3 != 3) {
      pCVar4 = ContextManager::get();
      format_abi_cxx11_(&local_50,"Failed to kill all processes in box: %m");
      (**pCVar4->_vptr_ContextManager)(pCVar4,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  set_standard_handler_restart(0xe,true);
  while( true ) {
    do {
      _Var2 = wait(local_2c);
    } while (-1 < _Var2);
    piVar3 = __errno_location();
    if (*piVar3 == 10) break;
    pCVar4 = ContextManager::get();
    format_abi_cxx11_(&local_50,"kill_all() wait() failed: %m");
    (**pCVar4->_vptr_ContextManager)(pCVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  set_standard_handler_restart(0xe,false);
  return;
}

Assistant:

void Container::kill_all() {
    stop_timer();
    if (kill(-1, SIGKILL) != 0 && errno != ESRCH) {
        die(format("Failed to kill all processes in box: %m"));
    }
    set_standard_handler_restart(SIGALRM, true);
    while (true) {
        int status;
        pid_t pid = wait(&status);
        if (pid < 0) {
            if (errno == ECHILD) {
                break;
            }
            die(format("kill_all() wait() failed: %m"));
        }
    }
    set_standard_handler_restart(SIGALRM, false);
}